

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendOperator(ScriptBuilder *this,ScriptType type)

{
  pointer *ppuVar1;
  iterator __position;
  uchar local_9;
  
  local_9 = (uchar)type;
  __position._M_current =
       (this->script_byte_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->script_byte_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->script_byte_array_,
               __position,&local_9);
  }
  else {
    *__position._M_current = local_9;
    ppuVar1 = &(this->script_byte_array_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendOperator(ScriptType type) {
  script_byte_array_.push_back(type);
  return *this;
}